

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventmultiplexer.cxx
# Opt level: O2

bool __thiscall EventMultiplexer::addSource(EventMultiplexer *this,StochasticEventGenerator *source)

{
  pointer ppSVar1;
  pointer ppSVar2;
  StochasticEventGenerator *local_18;
  
  ppSVar1 = (this->multiSources).
            super__Vector_base<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppSVar2 = (this->multiSources).
            super__Vector_base<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_18 = source;
  std::vector<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>::push_back
            (&this->multiSources,&local_18);
  return (long)(this->multiSources).
               super__Vector_base<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->multiSources).
               super__Vector_base<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3 ==
         (ulong)((int)((ulong)((long)ppSVar1 - (long)ppSVar2) >> 3) + 1);
}

Assistant:

bool EventMultiplexer::addSource( StochasticEventGenerator *source )
{
	uint sizeBefore = multiSources.size();
	multiSources.push_back(source);

	return multiSources.size() == sizeBefore+1;
}